

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.h
# Opt level: O3

RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> __thiscall
capnp::
makeRpcServer<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestProvisionId,capnproto_test::capnp::test::TestRecipientId,capnproto_test::capnp::test::TestThirdPartyCapId,capnproto_test::capnp::test::TestJoinResult,capnp::RealmGateway<capnproto_test::capnp::test::TestSturdyRef,capnp::Text,capnp::AnyPointer,capnp::AnyPointer>::Client,capnproto_test::capnp::test::TestSturdyRef,capnp::Text>
          (capnp *this,
          VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestProvisionId,_capnproto_test::capnp::test::TestRecipientId,_capnproto_test::capnp::test::TestThirdPartyCapId,_capnproto_test::capnp::test::TestJoinResult>
          *network,Client *bootstrapInterface,Client *gateway)

{
  undefined8 uVar1;
  Impl *extraout_RDX;
  Impl *extraout_RDX_00;
  Impl *extraout_RDX_01;
  Impl *pIVar2;
  RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> RVar3;
  Maybe<capnp::Capability::Client> local_60;
  undefined1 local_48 [32];
  undefined8 *local_28;
  long *plStack_20;
  
  local_60.ptr.isSet = true;
  local_60.ptr.field_1._0_4_ = *(undefined4 *)&(bootstrapInterface->hook).disposer;
  local_60.ptr.field_1._4_4_ = *(undefined4 *)((long)&(bootstrapInterface->hook).disposer + 4);
  local_60.ptr.field_1.value.hook.ptr = (bootstrapInterface->hook).ptr;
  (bootstrapInterface->hook).ptr = (ClientHook *)0x0;
  (**(code **)(**(long **)(&gateway->field_0x8 + (long)gateway->_vptr_Client[-3]) + 0x20))
            (&local_28);
  local_48[0] = true;
  local_48._16_8_ = local_28;
  local_48._24_8_ = plStack_20;
  local_48._8_8_ =
       &RealmGateway<capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer>::
        Client::typeinfo;
  RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId>::
  RpcSystem<capnproto_test::capnp::test::TestProvisionId,capnproto_test::capnp::test::TestRecipientId,capnproto_test::capnp::test::TestThirdPartyCapId,capnproto_test::capnp::test::TestJoinResult>
            ((RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> *)this,network,&local_60,
             (Maybe<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::Client>
              *)local_48);
  uVar1 = local_48._24_8_;
  pIVar2 = extraout_RDX;
  if ((local_48[0] == true) && ((long *)local_48._24_8_ != (long *)0x0)) {
    local_48._24_8_ = (long *)0x0;
    (*(code *)**(undefined8 **)local_48._16_8_)
              (local_48._16_8_,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
    pIVar2 = extraout_RDX_00;
  }
  uVar1 = local_60.ptr.field_1.value.hook.ptr;
  if (((local_60.ptr.isSet & 1U) != 0) && (local_60.ptr.field_1.value.hook.ptr != (ClientHook *)0x0)
     ) {
    local_60.ptr.field_1.value.hook.ptr = (ClientHook *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_60.ptr.field_1._4_4_,local_60.ptr.field_1._0_4_))
              ((undefined8 *)CONCAT44(local_60.ptr.field_1._4_4_,local_60.ptr.field_1._0_4_),
               ((ClientHook *)uVar1)->_vptr_ClientHook[-2] +
               (long)&((ClientHook *)uVar1)->_vptr_ClientHook);
    pIVar2 = extraout_RDX_01;
  }
  RVar3.super_RpcSystemBase.impl.ptr = pIVar2;
  RVar3.super_RpcSystemBase.impl.disposer = (Disposer *)this;
  return (RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId>)RVar3.super_RpcSystemBase.impl
  ;
}

Assistant:

RpcSystem<VatId> makeRpcServer(
    VatNetwork<VatId, ProvisionId, RecipientId, ThirdPartyCapId, JoinResult>& network,
    Capability::Client bootstrapInterface, RealmGatewayClient gateway) {
  return RpcSystem<VatId>(network, kj::mv(bootstrapInterface),
      gateway.template castAs<RealmGateway<>>());
}